

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

float __thiscall sentencepiece::unigram::Lattice::CalculateEntropy(Lattice *this,float inv_theta)

{
  Node *pNVar1;
  pointer ppNVar2;
  Node *pNVar3;
  long lVar4;
  pointer pfVar5;
  uint uVar6;
  ulong uVar7;
  pointer ppNVar8;
  ulong uVar9;
  pointer ppNVar10;
  float fVar11;
  value_type *__range4;
  vector<float,_std::allocator<float>_> alpha;
  vector<float,_std::allocator<float>_> H;
  allocator_type local_b5;
  float local_b4;
  pointer local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  Lattice *local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  _Vector_base<float,_std::allocator<float>_> local_60;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  uVar6 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  uVar9 = 0;
  if (0 < (int)uVar6) {
    uVar9 = (ulong)uVar6;
  }
  local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_b4 = inv_theta;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,
             (this->node_allocator_).chunk_index_ * (this->node_allocator_).chunk_size_ +
             (this->node_allocator_).element_index_,(value_type_conflict5 *)&local_60,&local_b5);
  ForwardAlgorithm((vector<float,_std::allocator<float>_> *)&local_60,this,local_b4);
  local_b0 = (this->begin_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (ulong)((int)uVar9 + 1);
  uVar7 = 0;
  local_88 = uVar9;
  local_80 = this;
  while (uVar7 != local_98) {
    local_70 = *(pointer *)
                ((long)&local_b0[uVar7].
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data + 8);
    local_78 = (this->end_nodes_).
               super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7;
    ppNVar8 = local_b0[uVar7].
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_90 = uVar7;
    while (pfVar5 = local_48._M_impl.super__Vector_impl_data._M_start, ppNVar8 != local_70) {
      pNVar1 = *ppNVar8;
      ppNVar2 = *(pointer *)
                 ((long)&(local_78->
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         )._M_impl.super__Vector_impl_data + 8);
      lVar4 = CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_60._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_68 = ppNVar8;
      for (ppNVar10 = (local_78->
                      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppNVar10 != ppNVar2;
          ppNVar10 = ppNVar10 + 1) {
        pNVar3 = *ppNVar10;
        local_a8 = (pNVar3->score * local_b4 + *(float *)(lVar4 + (ulong)pNVar3->node_id * 4)) -
                   *(float *)(lVar4 + (ulong)pNVar1->node_id * 4);
        fVar11 = expf(local_a8);
        uVar6 = pNVar1->node_id;
        pfVar5[uVar6] = (local_a8 + pfVar5[pNVar3->node_id]) * fVar11 + pfVar5[uVar6];
      }
      this = local_80;
      uVar9 = local_88;
      ppNVar8 = local_68 + 1;
    }
    uVar7 = local_90 + 1;
  }
  local_a8 = -local_48._M_impl.super__Vector_impl_data._M_start
              [*(uint *)(**(long **)&local_b0[uVar9 & 0xffffffff].
                                     super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                     ._M_impl.super__Vector_impl_data + 0x18)];
  uStack_a4 = 0x80000000;
  uStack_a0 = 0x80000000;
  uStack_9c = 0x80000000;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_60);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return local_a8;
}

Assistant:

float Lattice::CalculateEntropy(float inv_theta) const {
  const int len = size();

  // alpha[node_id] is the marginal prob of sequence up to start of node
  // H is entropy of sequence
  // the index of alpha/H is Node::node_id.
  std::vector<float> H(node_allocator_.size(), 0.0);

  // Populate the forward marginals to get the normalising constant
  const auto alpha = ForwardAlgorithm(inv_theta);

  // Now populate the forward entropies
  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      for (Node *lnode : end_nodes_[pos]) {
        // Contribution each lnode makes = p(lnode) * (H(lnode) + log p(lnode))

        // We have to normalise p(lnode) by the marginal contribution it makes
        const float lnode_transition_prob =
            ((inv_theta * lnode->score) + alpha[lnode->node_id] -
             alpha[rnode->node_id]);
        H[rnode->node_id] += std::exp(lnode_transition_prob) *
                             (H[lnode->node_id] + lnode_transition_prob);
      }
    }
  }

  return -H[begin_nodes_[len][0]->node_id];
}